

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenFBBValueCast_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  Type type;
  undefined8 unaff_RBX;
  undefined1 in_stack_ffffffffffffffe8 [16];
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 < BASE_TYPE_FLOAT) &&
     ((0x552U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    type._8_16_ = in_stack_ffffffffffffffe8;
    type._0_8_ = *(undefined8 *)&(field->value).type.fixed_length;
    type._24_8_ = unaff_RBX;
    CastToSigned_abi_cxx11_(type);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&stack0xfffffffffffffff7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFBBValueCast(const FieldDef &field) const {
    if (IsUnsigned(field.value.type.base_type)) {
      return CastToSigned(field.value.type);
    }
    return "";
  }